

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

void __thiscall cmVariableWatchCommand::cmVariableWatchCommand(cmVariableWatchCommand *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmVariableWatchCommand_005e88b8;
  p_Var1 = &(this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

cmVariableWatchCommand::cmVariableWatchCommand() = default;